

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O3

void __thiscall
icu_63::Calendar::computeGregorianAndDOWFields(Calendar *this,int32_t julianDay,UErrorCode *ec)

{
  uint uVar1;
  int iVar2;
  char cVar3;
  int iVar4;
  double dVar5;
  int32_t gregorianDayOfWeekUnused;
  int32_t local_14;
  
  Grego::dayToFields((double)(julianDay + -0x253d8c),&this->fGregorianYear,&this->fGregorianMonth,
                     &this->fGregorianDayOfMonth,&local_14,&this->fGregorianDayOfYear);
  dVar5 = uprv_fmod_63((double)julianDay + 1.0,7.0);
  cVar3 = '\b';
  if (-1 < (char)(int)dVar5) {
    cVar3 = '\x01';
  }
  uVar1 = (uint)(byte)(cVar3 + (char)(int)dVar5);
  this->fFields[7] = uVar1;
  this->fStamp[7] = 1;
  this->fIsSet[7] = '\x01';
  iVar2 = uVar1 - this->fFirstDayOfWeek;
  iVar4 = iVar2 + 8;
  if (-1 < iVar2) {
    iVar4 = iVar2 + 1;
  }
  this->fStamp[0x12] = 1;
  this->fIsSet[0x12] = '\x01';
  this->fFields[0x12] = iVar4;
  return;
}

Assistant:

void Calendar::computeGregorianAndDOWFields(int32_t julianDay, UErrorCode &ec)
{
    computeGregorianFields(julianDay, ec);

    // Compute day of week: JD 0 = Monday
    int32_t dow = julianDayToDayOfWeek(julianDay);
    internalSet(UCAL_DAY_OF_WEEK,dow);

    // Calculate 1-based localized day of week
    int32_t dowLocal = dow - getFirstDayOfWeek() + 1;
    if (dowLocal < 1) {
        dowLocal += 7;
    }
    internalSet(UCAL_DOW_LOCAL,dowLocal);
    fFields[UCAL_DOW_LOCAL] = dowLocal;
}